

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_node __thiscall
pugi::xml_node::insert_child_after(xml_node *this,xml_node_type type_,xml_node *node)

{
  ulong uVar1;
  xml_allocator *this_00;
  xml_node_struct *pxVar2;
  xml_node_struct *pxVar3;
  xml_node_struct *pxVar4;
  xml_node_struct *in_RAX;
  xml_node_struct *pxVar5;
  uint uVar6;
  xml_node_struct *pxVar7;
  xml_node n;
  xml_node local_18;
  
  pxVar5 = this->_root;
  if (pxVar5 == (xml_node_struct *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (uint)pxVar5->header & 0xf;
  }
  if ((((node_document < type_) && (0xfffffffd < uVar6 - 3)) &&
      ((type_ + ~node_doctype < 0xfffffffe || (uVar6 == 1)))) &&
     ((node->_root != (xml_node_struct *)0x0 && (node->_root->parent == pxVar5)))) {
    if (pxVar5 == (xml_node_struct *)0x0) {
      __assert_fail("object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x486,
                    "xml_allocator &pugi::impl::(anonymous namespace)::get_allocator(const Object *) [Object = pugi::xml_node_struct]"
                   );
    }
    this_00 = *(xml_allocator **)((long)pxVar5 - (pxVar5->header >> 8));
    uVar1 = this_00->_busy_size + 0x40;
    if (uVar1 < 0x7fd9) {
      local_18._root = (xml_node_struct *)this_00->_root;
      pxVar5 = (xml_node_struct *)((long)&(local_18._root)->prev_sibling_c + this_00->_busy_size);
      this_00->_busy_size = uVar1;
    }
    else {
      local_18._root = in_RAX;
      pxVar5 = (xml_node_struct *)
               impl::anon_unknown_0::xml_allocator::allocate_memory_oob
                         (this_00,0x40,(xml_memory_page **)&local_18);
    }
    if (pxVar5 == (xml_node_struct *)0x0) {
      pxVar5 = (xml_node_struct *)0x0;
    }
    else {
      pxVar5->first_child = (xml_node_struct *)0x0;
      pxVar5->prev_sibling_c = (xml_node_struct *)0x0;
      pxVar5->next_sibling = (xml_node_struct *)0x0;
      pxVar5->first_attribute = (xml_attribute_struct *)0x0;
      pxVar5->name = (char_t *)0x0;
      pxVar5->value = (char_t *)0x0;
      pxVar5->parent = (xml_node_struct *)0x0;
      pxVar5->first_child = (xml_node_struct *)0x0;
      pxVar5->header = (ulong)type_ | ((long)pxVar5 - (long)local_18._root) * 0x100;
    }
    if (pxVar5 != (xml_node_struct *)0x0) {
      pxVar2 = node->_root;
      pxVar3 = pxVar2->parent;
      pxVar5->parent = pxVar3;
      pxVar4 = pxVar2->next_sibling;
      pxVar7 = pxVar4;
      if (pxVar4 == (xml_node_struct *)0x0) {
        pxVar7 = pxVar3->first_child;
      }
      pxVar7->prev_sibling_c = pxVar5;
      pxVar5->next_sibling = pxVar4;
      pxVar5->prev_sibling_c = pxVar2;
      pxVar2->next_sibling = pxVar5;
      if (type_ == node_declaration) {
        local_18._root = pxVar5;
        set_name(&local_18,"xml");
        return (xml_node)local_18._root;
      }
      return (xml_node)pxVar5;
    }
  }
  return (xml_node)(xml_node_struct *)0x0;
}

Assistant:

PUGI__FN xml_node xml_node::insert_child_after(xml_node_type type_, const xml_node& node)
	{
		if (!impl::allow_insert_child(type(), type_)) return xml_node();
		if (!node._root || node._root->parent != _root) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		xml_node n(impl::allocate_node(alloc, type_));
		if (!n) return xml_node();

		impl::insert_node_after(n._root, node._root);

		if (type_ == node_declaration) n.set_name(PUGIXML_TEXT("xml"));

		return n;
	}